

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::DTDScanner::getQuotedString(DTDScanner *this,XMLBuffer *toFill)

{
  bool bVar1;
  XMLCh XVar2;
  XMLSize_t XVar3;
  XMLCh quoteCh;
  XMLCh local_1a;
  
  toFill->fIndex = 0;
  bVar1 = ReaderMgr::skipIfQuote(this->fReaderMgr,&local_1a);
  if (bVar1) {
    XVar2 = ReaderMgr::getNextChar(this->fReaderMgr);
    bVar1 = XVar2 == local_1a;
    if (XVar2 != L'\0' && !bVar1) {
      do {
        XVar3 = toFill->fIndex;
        if (XVar3 == toFill->fCapacity) {
          XMLBuffer::ensureCapacity(toFill,1);
          XVar3 = toFill->fIndex;
        }
        toFill->fIndex = XVar3 + 1;
        toFill->fBuffer[XVar3] = XVar2;
        XVar2 = ReaderMgr::getNextChar(this->fReaderMgr);
        bVar1 = XVar2 == local_1a;
      } while ((XVar2 != L'\0') && (XVar2 != local_1a));
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DTDScanner::getQuotedString(XMLBuffer& toFill)
{
    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

	XMLCh nextCh;
    // Get another char and see if it matches the starting quote char
    while ((nextCh=fReaderMgr->getNextChar())!=quoteCh)
    {
        //
        //  We should never get either an end of file null char here. If we
        //  do, just fail. It will be handled more gracefully in the higher
        //  level code that called us.
        //
        if (!nextCh)
            return false;

        // Else add it to the buffer
        toFill.append(nextCh);
    }
    return true;
}